

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

int nes_system_load_state(nes_system *system,void *buffer,size_t buffer_size)

{
  nes_cartridge *pnVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (buffer != (void *)0x0) {
    pnVar1 = system->cartridge;
    bVar2 = pnVar1->mapper->state_size + 0x69ac <= buffer_size;
    if (bVar2) {
      memcpy(system,buffer,0x69ac);
      memcpy(pnVar1->mapper_state,(void *)((long)buffer + 0x69ac),pnVar1->mapper->state_size);
    }
    uVar3 = (uint)bVar2;
  }
  return uVar3;
}

Assistant:

int nes_system_load_state(nes_system* system, const void* buffer, size_t buffer_size)
{
    size_t state_size = nes_system_get_state_size(system);
    
    if (buffer && buffer_size >= state_size)
    {
        memcpy(&system->state,                   buffer,                                   sizeof(nes_system_state));
        memcpy(system->cartridge->mapper_state, (char*)buffer + sizeof(nes_system_state),  system->cartridge->mapper->state_size);
        return 1;
    }

    return 0;
}